

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u8 *puVar1;
  u8 *__src;
  ulong uVar2;
  ushort uVar3;
  u8 *__dest;
  long lVar4;
  ulong uVar5;
  size_t __n;
  int iVar6;
  long lVar7;
  u8 *puVar8;
  int rc;
  int local_74;
  u8 *local_70;
  int local_34;
  
  if (nCell < 1) {
    return 0;
  }
  puVar1 = pPg->aData;
  local_70 = *ppData;
  iVar6 = nCell + iFirst;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (5 < uVar5) break;
    uVar2 = uVar5 + 1;
  } while (pCArray->ixNx[uVar5] <= iFirst);
  local_74 = (int)(uVar5 + 1) + -1;
  puVar8 = pCArray->apEnd[uVar5];
  lVar4 = (long)iFirst;
  while( true ) {
    lVar7 = lVar4 + 1;
    uVar3 = pCArray->szCell[lVar4];
    if (uVar3 == 0) {
      uVar3 = computeCellSize(pCArray,iFirst);
    }
    if (((puVar1[1] == '\0') && (puVar1[2] == '\0')) ||
       (__dest = pageFindSlot(pPg,(uint)uVar3,&local_34), __dest == (u8 *)0x0)) {
      __n = (size_t)(uint)uVar3;
      if ((long)local_70 - (long)pBegin < (long)__n) {
        return 1;
      }
      __dest = local_70 + -__n;
      local_70 = __dest;
    }
    else {
      __n = (size_t)uVar3;
    }
    __src = pCArray->apCell[lVar4];
    if ((__src < puVar8) && (puVar8 < __src + __n)) break;
    memmove(__dest,__src,__n);
    uVar3 = (short)__dest - (short)puVar1;
    *(ushort *)pCellptr = uVar3 * 0x100 | uVar3 >> 8;
    if (iVar6 <= lVar7) {
      *ppData = local_70;
      return 0;
    }
    lVar4 = (long)local_74;
    if (pCArray->ixNx[lVar4] <= lVar7) {
      local_74 = local_74 + 1;
      puVar8 = pCArray->apEnd[lVar4 + 1];
    }
    iFirst = iFirst + 1;
    pCellptr = (u8 *)((long)pCellptr + 2);
    lVar4 = lVar7;
  }
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1122e,
              "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  return 1;
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content-area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i = iFirst;                 /* Loop counter - cell index to insert */
  u8 *aData = pPg->aData;         /* Complete page */
  u8 *pData = *ppData;            /* Content area.  A subset of aData[] */
  int iEnd = iFirst + nCell;      /* End of loop. One past last cell to ins */
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pEnd;                       /* Maximum extent of cell data */
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  if( iEnd<=iFirst ) return 0;
  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pEnd = pCArray->apEnd[k];
  while( 1 /*Exit by break*/ ){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    if( (uptr)(pCArray->apCell[i]+sz)>(uptr)pEnd
     && (uptr)(pCArray->apCell[i])<(uptr)pEnd
    ){
      assert( CORRUPT_DB );
      (void)SQLITE_CORRUPT_BKPT;
      return 1;
    }
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pEnd = pCArray->apEnd[k];
    }
  }
  *ppData = pData;
  return 0;
}